

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a2934::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader
          (JobEvalCacheMocT *this,SourceFileHandleT *headerHandle,string_view includerDir,
          string_view includeBase)

{
  anon_class_16_2_08d426fe_for__M_pred __pred;
  string_view view;
  string_view view_00;
  bool bVar1;
  MocSettingsT *pMVar2;
  const_iterator __first;
  const_iterator __last;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includePaths;
  cmAlphaNum local_e8;
  char *local_b8;
  char *pcStack_b0;
  cmAlphaNum local_a0;
  string local_70;
  undefined1 local_50 [8];
  anon_class_16_2_3be181d0 findHeader;
  SourceFileHandleT *headerHandle_local;
  JobEvalCacheMocT *this_local;
  string_view includeBase_local;
  string_view includerDir_local;
  
  includeBase_local._M_str = (char *)includerDir._M_len;
  includeBase_local._M_len = (size_t)includeBase._M_str;
  this_local = (JobEvalCacheMocT *)includeBase._M_len;
  findHeader.headerHandle = headerHandle;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_JobEvalCacheT).SearchLocations);
  findHeader.this = (JobEvalCacheMocT *)findHeader.headerHandle;
  local_b8 = includeBase_local._M_str;
  view_00._M_str = includerDir._M_str;
  view_00._M_len = (size_t)includeBase_local._M_str;
  pcStack_b0 = includerDir._M_str;
  local_50 = (undefined1  [8])this;
  cmAlphaNum::cmAlphaNum(&local_a0,view_00);
  view._M_str = (char *)includeBase_local._M_len;
  view._M_len = (size_t)this_local;
  cmAlphaNum::cmAlphaNum(&local_e8,view);
  cmStrCat<>(&local_70,&local_a0,&local_e8);
  bVar1 = FindIncludedHeader::anon_class_16_2_3be181d0::operator()
                    ((anon_class_16_2_3be181d0 *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (bVar1) {
    includerDir_local._M_str._7_1_ = true;
  }
  else {
    pMVar2 = JobT::MocConst((JobT *)this);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&pMVar2->IncludePaths);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&pMVar2->IncludePaths);
    __pred.includeBase = (string_view *)&this_local;
    __pred.findHeader = (anon_class_16_2_3be181d0 *)local_50;
    includerDir_local._M_str._7_1_ =
         std::
         any_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
                   ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__first._M_current,
                    (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__last._M_current,__pred);
  }
  return includerDir_local._M_str._7_1_;
}

Assistant:

bool cmQtAutoMocUicT::JobEvalCacheMocT::FindIncludedHeader(
  SourceFileHandleT& headerHandle, cm::string_view includerDir,
  cm::string_view includeBase)
{
  // Clear search locations
  this->SearchLocations.clear();

  auto findHeader = [this,
                     &headerHandle](std::string const& basePath) -> bool {
    bool found = false;
    for (std::string const& ext : this->BaseConst().HeaderExtensions) {
      std::string const testPath =
        this->Gen()->CollapseFullPathTS(cmStrCat(basePath, '.', ext));
      cmFileTime fileTime;
      if (!fileTime.Load(testPath)) {
        // File not found
        continue;
      }

      // Return a known file if it exists already
      {
        auto it = this->BaseEval().Headers.find(testPath);
        if (it != this->BaseEval().Headers.end()) {
          headerHandle = it->second;
          found = true;
          break;
        }
      }

      // Created and return discovered file entry
      {
        SourceFileHandleT& handle =
          this->MocEval().HeadersDiscovered[testPath];
        if (!handle) {
          handle = std::make_shared<SourceFileT>(testPath);
          handle->FileTime = fileTime;
          handle->IsHeader = true;
          handle->Moc = true;
        }
        headerHandle = handle;
        found = true;
        break;
      }
    }
    if (!found) {
      this->SearchLocations.emplace_back(cmQtAutoGen::ParentDir(basePath));
    }
    return found;
  };

  // Search in vicinity of the source
  if (findHeader(cmStrCat(includerDir, includeBase))) {
    return true;
  }
  // Search in include directories
  auto const& includePaths = this->MocConst().IncludePaths;
  return std::any_of(
    includePaths.begin(), includePaths.end(),
    [&findHeader, &includeBase](std::string const& path) -> bool {
      return findHeader(cmStrCat(path, '/', includeBase));
    });
}